

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void backward::SignalHandling::sig_handler(int signo,siginfo_t *info,void *_ctx)

{
  handleSignal(signo,info,_ctx);
  raise(info->si_signo);
  puts("watf? exit");
  _exit(1);
}

Assistant:

static void
  sig_handler(int signo, siginfo_t *info, void *_ctx) {
    handleSignal(signo, info, _ctx);

    // try to forward the signal.
    raise(info->si_signo);

    // terminate the process immediately.
    puts("watf? exit");
    _exit(EXIT_FAILURE);
  }